

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_create_filename(char *zDatabase,char *zJournal,char *zWal,int nParam,char **azParam)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  void *__s;
  char *pcVar4;
  char *local_58;
  char *p;
  char *pResult;
  sqlite3_uint64 sStack_40;
  int i;
  sqlite3_int64 nByte;
  char **azParam_local;
  int nParam_local;
  char *zWal_local;
  char *zJournal_local;
  char *zDatabase_local;
  
  sVar1 = strlen(zDatabase);
  sVar2 = strlen(zJournal);
  sVar3 = strlen(zWal);
  sStack_40 = sVar1 + sVar2 + sVar3 + 10;
  for (pResult._4_4_ = 0; SBORROW4(pResult._4_4_,nParam * 2) != pResult._4_4_ + nParam * -2 < 0;
      pResult._4_4_ = pResult._4_4_ + 1) {
    sVar1 = strlen(azParam[pResult._4_4_]);
    sStack_40 = sVar1 + 1 + sStack_40;
  }
  __s = sqlite3_malloc64(sStack_40);
  if (__s == (void *)0x0) {
    zDatabase_local = (char *)0x0;
  }
  else {
    memset(__s,0,4);
    local_58 = appendText((char *)((long)__s + 4),zDatabase);
    for (pResult._4_4_ = 0; SBORROW4(pResult._4_4_,nParam * 2) != pResult._4_4_ + nParam * -2 < 0;
        pResult._4_4_ = pResult._4_4_ + 1) {
      local_58 = appendText(local_58,azParam[pResult._4_4_]);
    }
    *local_58 = '\0';
    pcVar4 = appendText(local_58 + 1,zJournal);
    pcVar4 = appendText(pcVar4,zWal);
    *pcVar4 = '\0';
    pcVar4[1] = '\0';
    zDatabase_local = (char *)((long)__s + 4);
  }
  return zDatabase_local;
}

Assistant:

SQLITE_API char *sqlite3_create_filename(
  const char *zDatabase,
  const char *zJournal,
  const char *zWal,
  int nParam,
  const char **azParam
){
  sqlite3_int64 nByte;
  int i;
  char *pResult, *p;
  nByte = strlen(zDatabase) + strlen(zJournal) + strlen(zWal) + 10;
  for(i=0; i<nParam*2; i++){
    nByte += strlen(azParam[i])+1;
  }
  pResult = p = sqlite3_malloc64( nByte );
  if( p==0 ) return 0;
  memset(p, 0, 4);
  p += 4;
  p = appendText(p, zDatabase);
  for(i=0; i<nParam*2; i++){
    p = appendText(p, azParam[i]);
  }
  *(p++) = 0;
  p = appendText(p, zJournal);
  p = appendText(p, zWal);
  *(p++) = 0;
  *(p++) = 0;
  assert( (sqlite3_int64)(p - pResult)==nByte );
  return pResult + 4;
}